

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,TestContext *testCtx,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *shaderOp,ShaderDataSpec *spec)

{
  uint uVar1;
  float fVar2;
  DataType DVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  DataType DVar7;
  float fVar8;
  float fVar9;
  DataType DVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  ShaderEvaluator *this_00;
  char *pcVar15;
  ostream *poVar16;
  char *pcVar17;
  int precision;
  int inputNdx;
  long lVar18;
  int inputNdx_3;
  Precision PVar19;
  undefined1 *puVar20;
  int inputNdx_2;
  ostringstream *poVar21;
  ShaderValue *pSVar22;
  bool bVar23;
  allocator<char> local_419;
  ostringstream *local_418;
  undefined8 uStack_410;
  char *local_400;
  float resultScale;
  string local_3f0;
  string *local_3d0;
  ShaderValue *local_3c8;
  undefined1 *local_3c0;
  string local_3b8;
  string local_398;
  string prefix;
  string header;
  char *inputPrecision [3];
  ostringstream vtx;
  ostringstream frag;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtx,caseName,(allocator<char> *)&header);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&frag,description,(allocator<char> *)&prefix);
  this_00 = (ShaderEvaluator *)operator_new(0x28);
  local_418._0_4_ = spec->referenceScale;
  local_418._4_4_ = spec->referenceBias;
  uStack_410 = 0;
  iVar14 = glu::getDataTypeScalarSize(spec->output);
  ShaderEvaluator::ShaderEvaluator(this_00);
  this_00->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00bffe80;
  this_00[1]._vptr_ShaderEvaluator = (_func_int **)evalFunc;
  *(int *)&this_00[1].m_evalFunc = iVar14;
  *(ostringstream **)((long)&this_00[1].m_evalFunc + 4) = local_418;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,(string *)&vtx,(string *)&frag,isVertexCase,
             this_00,(UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  std::__cxx11::string::~string((string *)&frag);
  std::__cxx11::string::~string((string *)&vtx);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_00bffe20;
  fVar2 = spec->resultBias;
  fVar5 = spec->referenceScale;
  fVar6 = spec->referenceBias;
  PVar19 = spec->precision;
  DVar3 = spec->output;
  iVar14 = spec->numInputs;
  DVar7 = spec->inputs[0].type;
  fVar8 = spec->inputs[0].rangeMin;
  fVar9 = spec->inputs[0].rangeMax;
  DVar10 = spec->inputs[1].type;
  fVar11 = spec->inputs[1].rangeMin;
  uVar4 = *(undefined8 *)&spec->inputs[1].rangeMax;
  fVar12 = spec->inputs[2].rangeMin;
  fVar13 = spec->inputs[2].rangeMax;
  (this->m_spec).resultScale = spec->resultScale;
  (this->m_spec).resultBias = fVar2;
  (this->m_spec).referenceScale = fVar5;
  (this->m_spec).referenceBias = fVar6;
  (this->m_spec).precision = PVar19;
  (this->m_spec).output = DVar3;
  (this->m_spec).numInputs = iVar14;
  (this->m_spec).inputs[0].type = DVar7;
  (this->m_spec).inputs[0].rangeMin = fVar8;
  (this->m_spec).inputs[0].rangeMax = fVar9;
  (this->m_spec).inputs[1].type = DVar10;
  (this->m_spec).inputs[1].rangeMin = fVar11;
  *(undefined8 *)&(this->m_spec).inputs[1].rangeMax = uVar4;
  (this->m_spec).inputs[2].rangeMin = fVar12;
  (this->m_spec).inputs[2].rangeMax = fVar13;
  local_3d0 = (string *)&this->m_shaderOp;
  std::__cxx11::string::string(local_3d0,(string *)shaderOp);
  PVar19 = (this->m_spec).precision;
  if (PVar19 == PRECISION_LAST) {
    local_400 = (char *)0x0;
  }
  else {
    local_400 = glu::getPrecisionName(PVar19);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar21 = (ostringstream *)&frag;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    poVar21 = (ostringstream *)&vtx;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"#version 310 es\n",(allocator<char> *)&prefix);
  std::operator<<((ostream *)&vtx,(string *)&header);
  std::operator<<((ostream *)&frag,(string *)&header);
  pSVar22 = (this->m_spec).inputs;
  local_418 = poVar21;
  local_3c8 = pSVar22;
  for (lVar18 = 0; lVar18 < (this->m_spec).numInputs; lVar18 = lVar18 + 1) {
    PVar19 = PRECISION_HIGHP;
    if (7 < pSVar22->type - TYPE_INT) {
      PVar19 = (this->m_spec).precision;
    }
    if (pSVar22->type - TYPE_BOOL < 4) {
      PVar19 = PRECISION_MEDIUMP;
    }
    pcVar15 = glu::getPrecisionName(PVar19);
    inputPrecision[lVar18] = pcVar15;
    pSVar22 = pSVar22 + 1;
  }
  std::operator<<((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n");
  poVar21 = local_418;
  for (lVar18 = 0; lVar18 < (this->m_spec).numInputs; lVar18 = lVar18 + 1) {
    poVar16 = std::operator<<((ostream *)&vtx,"layout(location = ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar18 + 4);
    poVar16 = std::operator<<(poVar16,") in ");
    poVar16 = std::operator<<(poVar16,inputPrecision[lVar18]);
    poVar16 = std::operator<<(poVar16," vec4 a_in");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar18);
    std::operator<<(poVar16,";\n");
  }
  std::operator<<((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n");
  if ((this->super_ShaderRenderCase).m_isVertexCase == false) {
    lVar18 = 0;
    while (lVar18 < (this->m_spec).numInputs) {
      poVar16 = std::operator<<((ostream *)&vtx,"layout(location = ");
      iVar14 = (int)(lVar18 + 1);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar14);
      poVar16 = std::operator<<(poVar16,") out ");
      pcVar15 = inputPrecision[lVar18];
      poVar16 = std::operator<<(poVar16,pcVar15);
      poVar16 = std::operator<<(poVar16," vec4 v_in");
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar18);
      std::operator<<(poVar16,";\n");
      poVar16 = std::operator<<((ostream *)&frag,"layout(location = ");
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar14);
      poVar16 = std::operator<<(poVar16,") in ");
      poVar16 = std::operator<<(poVar16,pcVar15);
      poVar16 = std::operator<<(poVar16," vec4 v_in");
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar14 + -1);
      std::operator<<(poVar16,";\n");
      lVar18 = lVar18 + 1;
    }
  }
  else {
    std::operator<<((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n");
    std::operator<<((ostream *)&frag,"layout(location = 0) in mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)&vtx,"\n");
  std::operator<<((ostream *)&vtx,"void main()\n");
  std::operator<<((ostream *)&vtx,"{\n");
  std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)&frag,"\n");
  std::operator<<((ostream *)&frag,"void main()\n");
  std::operator<<((ostream *)&frag,"{\n");
  pcVar15 = "v_";
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar15 = "a_";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,pcVar15,(allocator<char> *)&local_3f0);
  puVar20 = sr::(anonymous_namespace)::s_inSwizzles;
  lVar18 = 0;
  do {
    if ((this->m_spec).numInputs <= lVar18) {
      pcVar15 = glu::getDataTypeName((this->m_spec).output);
      DVar3 = (this->m_spec).output;
      std::operator<<((ostream *)poVar21,"\t");
      if ((local_400 != (char *)0x0) && (3 < DVar3 - TYPE_BOOL)) {
        poVar16 = std::operator<<((ostream *)poVar21,local_400);
        std::operator<<(poVar16," ");
      }
      poVar16 = std::operator<<((ostream *)poVar21,pcVar15);
      poVar16 = std::operator<<(poVar16," res = ");
      poVar16 = std::operator<<(poVar16,pcVar15);
      std::operator<<(poVar16,"(0.0);\n\n");
      poVar16 = std::operator<<((ostream *)poVar21,"\t");
      poVar16 = std::operator<<(poVar16,local_3d0);
      std::operator<<(poVar16,"\n\n");
      DVar3 = (this->m_spec).output;
      iVar14 = glu::getDataTypeScalarSize(DVar3);
      std::operator<<((ostream *)poVar21,"\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n");
      poVar16 = std::operator<<((ostream *)poVar21,"\tcolor.");
      lVar18 = (long)(iVar14 + -1);
      poVar16 = std::operator<<(poVar16,_ZN3vkt2sr12_GLOBAL__N_113s_outSwizzlesE_rel +
                                        *(int *)(_ZN3vkt2sr12_GLOBAL__N_113s_outSwizzlesE_rel +
                                                lVar18 * 4));
      std::operator<<(poVar16," = ");
      bVar23 = DVar3 - TYPE_FLOAT < 4;
      pcVar15 = "float(res)";
      if (bVar23) {
        pcVar15 = "res";
      }
      if (iVar14 != 1) {
        pcVar15 = "res";
      }
      poVar16 = (ostream *)poVar21;
      if (iVar14 != 1 && !bVar23) {
        poVar16 = std::operator<<((ostream *)poVar21,"vec");
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar14);
        pcVar15 = "(res)";
      }
      std::operator<<(poVar16,pcVar15);
      std::operator<<((ostream *)poVar21,";\n");
      resultScale = (this->m_spec).resultScale;
      fVar2 = (this->m_spec).resultBias;
      local_418 = (ostringstream *)CONCAT44(local_418._4_4_,fVar2);
      if ((((resultScale != 1.0) || (NAN(resultScale))) || (fVar2 != 0.0)) || (NAN(fVar2))) {
        std::operator<<((ostream *)poVar21,"\tcolor = color");
        if ((resultScale != 1.0) || (NAN(resultScale))) {
          poVar16 = std::operator<<((ostream *)poVar21," * ");
          de::toString<float>(&local_398,&resultScale);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"1.0",&local_419);
          twoValuedVec4(&local_3f0,&local_398,&local_3b8,
                        (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks + lVar18 * 4))
          ;
          std::operator<<(poVar16,(string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_398);
        }
        if ((local_418._0_4_ != 0.0) || (NAN(local_418._0_4_))) {
          poVar16 = std::operator<<((ostream *)poVar21," + ");
          de::floatToString_abi_cxx11_(&local_398,(de *)0x2,local_418._0_4_,precision);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"0.0",&local_419);
          twoValuedVec4(&local_3f0,&local_398,&local_3b8,
                        (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks + lVar18 * 4))
          ;
          std::operator<<(poVar16,(string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_398);
        }
        std::operator<<((ostream *)poVar21,";\n");
      }
      if ((this->super_ShaderRenderCase).m_isVertexCase == false) {
        pcVar15 = "\to_color = color;\n";
        for (iVar14 = 0; iVar14 < (this->m_spec).numInputs; iVar14 = iVar14 + 1) {
          poVar16 = std::operator<<((ostream *)&vtx,"\tv_in");
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar14);
          poVar16 = std::operator<<(poVar16," = a_in");
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar14);
          std::operator<<(poVar16,";\n");
        }
      }
      else {
        std::operator<<((ostream *)&vtx,"\tv_color = color;\n");
        pcVar15 = "\to_color = v_color;\n";
      }
      std::operator<<((ostream *)&frag,pcVar15);
      std::operator<<((ostream *)&vtx,"}\n");
      std::operator<<((ostream *)&frag,"}\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&header);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
      return;
    }
    DVar3 = local_3c8->type;
    iVar14 = glu::getDataTypeScalarSize(DVar3);
    pcVar17 = glu::getDataTypeName(DVar3);
    pcVar15 = *(char **)(puVar20 + (long)(iVar14 + -1) * 8);
    local_3c0 = puVar20;
    std::operator<<((ostream *)poVar21,"\t");
    uVar1 = DVar3 - TYPE_BOOL;
    if (local_400 != (char *)0x0 && 3 < uVar1) {
      poVar16 = std::operator<<((ostream *)local_418,local_400);
      std::operator<<(poVar16," ");
    }
    poVar16 = std::operator<<((ostream *)local_418,pcVar17);
    poVar16 = std::operator<<(poVar16," in");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar18);
    std::operator<<(poVar16," = ");
    if (uVar1 < 4) {
      pcVar17 = "greaterThan(";
      poVar16 = (ostream *)local_418;
      if (iVar14 == 1) {
        pcVar17 = "(";
      }
LAB_005d77b2:
      std::operator<<(poVar16,pcVar17);
    }
    else if (DVar3 - TYPE_INT < 8) {
      poVar16 = std::operator<<((ostream *)local_418,pcVar17);
      pcVar17 = "(";
      goto LAB_005d77b2;
    }
    poVar16 = std::operator<<((ostream *)local_418,(string *)&prefix);
    poVar16 = std::operator<<(poVar16,"in");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar18);
    poVar16 = std::operator<<(poVar16,".");
    std::operator<<(poVar16,pcVar15);
    poVar16 = (ostream *)local_418;
    if (uVar1 < 4) {
      pcVar15 = " > 0.0)";
      if (iVar14 != 1) {
        poVar16 = std::operator<<((ostream *)local_418,", vec");
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar14);
        pcVar15 = "(0.0))";
      }
LAB_005d7854:
      std::operator<<(poVar16,pcVar15);
    }
    else {
      pcVar15 = ")";
      if (DVar3 - TYPE_INT < 8) goto LAB_005d7854;
    }
    std::operator<<((ostream *)local_418,";\n");
    lVar18 = lVar18 + 1;
    puVar20 = local_3c0 + 0x20;
    local_3c8 = local_3c8 + 1;
    poVar21 = local_418;
  } while( true );
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (tcu::TestContext&		testCtx,
										const char*				caseName,
										const char*				description,
										const bool				isVertexCase,
										const ShaderEvalFunc	evalFunc,
										const std::string&		shaderOp,
										const ShaderDataSpec&	spec)
	: ShaderRenderCase	(testCtx,
						 caseName,
						 description,
						 isVertexCase,
						 new OperatorShaderEvaluator(evalFunc, spec.referenceScale, spec.referenceBias, getDataTypeScalarSize(spec.output)),
						 DE_NULL,
						 DE_NULL)
	, m_spec			(spec)
	, m_shaderOp		(shaderOp)
{
	setupShaderData();
}